

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insert
          (iterator *this,int left,int right,int *value,allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<int,_int,_0U> *this_01;
  uint32_t uVar1;
  IndexPair offset;
  size_type sVar2;
  pointer pEVar3;
  interval<int> ival;
  interval<int> local_30;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  local_30.left = left;
  local_30.right = right;
  if (this_01->height == 0) {
    uVar1 = IntervalMapDetails::LeafNode<int,_int,_16U,_true>::insertFrom
                      ((LeafNode<int,_int,_16U,_true> *)this_01,
                       (this->super_const_iterator).path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                       offset,this_01->rootSize,&local_30,value);
    if (uVar1 < 0x11) {
      this_01->rootSize = uVar1;
      ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
           uVar1;
      return;
    }
    offset = switchToBranch(this_01,(this->super_const_iterator).path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    data_[(this->super_const_iterator).path.path.
                                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                          .len - 1].offset,alloc);
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (this_00,(BranchNode<int,_12U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar2 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar2 == 0) ||
     (pEVar3 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar3->size <= pEVar3->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar3 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar2 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar1 = IntervalMapDetails::LeafNode<int,_int,_16U,_false>::insertFrom
                    ((LeafNode<int,_int,_16U,_false> *)pEVar3[sVar2 - 1].node,
                     pEVar3[sVar2 - 1].offset,pEVar3[sVar2 - 1].size,&local_30,value);
  if (0x10 < uVar1) {
    IntervalMap<int,int,0u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
              ((iterator *)this,
               (int)(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,alloc);
    pEVar3 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar2 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar1 = IntervalMapDetails::LeafNode<int,_int,_16U,_false>::insertFrom
                      ((LeafNode<int,_int,_16U,_false> *)pEVar3[sVar2 - 1].node,
                       pEVar3[sVar2 - 1].offset,pEVar3[sVar2 - 1].size,&local_30,value);
  }
  IntervalMapDetails::Path::setSize
            (this_00,(int)(this->super_const_iterator).path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,
             uVar1);
  updateParentBounds(this,(int)(this->super_const_iterator).path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                     ,&local_30);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}